

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_read_unsigned_bin(mp_int *a,uchar *b,int c)

{
  byte bVar1;
  int iVar2;
  
  if ((a->alloc < 2) && (iVar2 = mp_grow(a,2), iVar2 != 0)) {
    return iVar2;
  }
  mp_zero(a);
  while( true ) {
    if (c < 1) {
      mp_clamp(a);
      return 0;
    }
    iVar2 = mp_mul_2d(a,8,a);
    if (iVar2 != 0) break;
    bVar1 = *b;
    b = b + 1;
    *a->dp = *a->dp | (ulong)bVar1;
    a->used = a->used + 1;
    c = c + -1;
  }
  return iVar2;
}

Assistant:

int mp_read_unsigned_bin (mp_int * a, const unsigned char *b, int c)
{
  int     res;

  /* make sure there are at least two digits */
  if (a->alloc < 2) {
     if ((res = mp_grow(a, 2)) != MP_OKAY) {
        return res;
     }
  }

  /* zero the int */
  mp_zero (a);

  /* read the bytes in */
  while (c-- > 0) {
    if ((res = mp_mul_2d (a, 8, a)) != MP_OKAY) {
      return res;
    }

#ifndef MP_8BIT
      a->dp[0] |= *b++;
      a->used += 1;
#else
      a->dp[0] = (*b & MP_MASK);
      a->dp[1] |= ((*b++ >> 7U) & 1);
      a->used += 2;
#endif
  }
  mp_clamp (a);
  return MP_OKAY;
}